

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void MultiplicationHelper<unsigned_long,_long,_7>::
     MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *t,long *u,unsigned_long *ret)

{
  uint64_t tmp;
  uint64_t t1;
  uint64_t local_20;
  unsigned_long local_18;
  
  local_18 = *t;
  local_20 = 0;
  LargeIntRegMultiply<unsigned_long,_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_18,*u,&local_20);
  *ret = local_20;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void MultiplyThrow(const T& t, const U& u, T& ret) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<T>::isUint64 && safeint_internal::int_traits<U>::isInt64, "T must be Uint64, U Int64");
        std::uint64_t t1 = t;
        std::int64_t          u1 = u;
        std::uint64_t tmp = 0;
        LargeIntRegMultiply< std::uint64_t, std::int64_t >::template RegMultiplyThrow< E >(t1, u1, &tmp);
        ret = tmp;
    }